

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall
llvm::detail::DoubleAPFloat::roundToIntegral(DoubleAPFloat *this,roundingMode RM)

{
  APFloat *__ptr;
  opStatus oVar1;
  APFloat Tmp;
  undefined1 local_70 [8];
  _Head_base<0UL,_llvm::APFloat_*,_false> local_68;
  anon_union_8_2_1313ab2f_for_U local_60;
  uint local_58;
  APFloat local_50;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    bitcastToAPInt((DoubleAPFloat *)local_70);
    IEEEFloat::IEEEFloat
              (&local_50.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)local_70);
    if ((0x40 < (uint)local_68._M_head_impl) && (local_70 != (undefined1  [8])0x0)) {
      operator_delete__((void *)local_70);
    }
    oVar1 = APFloat::roundToIntegral(&local_50,RM);
    APFloat::bitcastToAPInt((APFloat *)&local_60);
    DoubleAPFloat((DoubleAPFloat *)local_70,(fltSemantics *)semPPCDoubleDouble,(APInt *)&local_60);
    if ((DoubleAPFloat *)local_70 != this) {
      __ptr = (this->Floats)._M_t.
              super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
              super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
              super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
      if (__ptr != (APFloat *)0x0) {
        std::default_delete<llvm::APFloat[]>::operator()
                  ((default_delete<llvm::APFloat[]> *)&this->Floats,__ptr);
      }
      (this->Floats)._M_t.
      super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
      super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
      super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl = (APFloat *)0x0;
      DoubleAPFloat(this,(DoubleAPFloat *)local_70);
    }
    if ((tuple<llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>)local_68._M_head_impl !=
        (_Head_base<0UL,_llvm::APFloat_*,_false>)0x0) {
      std::default_delete<llvm::APFloat[]>::operator()
                ((default_delete<llvm::APFloat[]> *)&local_68,local_68._M_head_impl);
    }
    local_68._M_head_impl = (APFloat *)0x0;
    if ((0x40 < local_58) && ((void *)local_60.VAL != (void *)0x0)) {
      operator_delete__(local_60.pVal);
    }
    APFloat::Storage::~Storage((Storage *)&local_50.U.IEEE);
    return oVar1;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x1052,
                "APFloat::opStatus llvm::detail::DoubleAPFloat::roundToIntegral(APFloat::roundingMode)"
               );
}

Assistant:

APFloat::opStatus DoubleAPFloat::roundToIntegral(APFloat::roundingMode RM) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy, bitcastToAPInt());
  auto Ret = Tmp.roundToIntegral(RM);
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}